

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::CPrimitiveRestartElements<glcts::(anonymous_namespace)::test_api::ES3>::
TriangleStipGen(CPrimitiveRestartElements<glcts::(anonymous_namespace)::test_api::ES3> *this,
               CColorArray *coords,float widthStart,float widthEnd,float heightStart,float heightEnd
               ,uint primNum)

{
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *pvVar1;
  Vector<float,_4> local_84;
  Vector<float,_4> local_74;
  Vector<float,_4> local_64;
  Vector<float,_4> local_54;
  float local_44;
  float local_40;
  float widthOffset;
  uint j;
  float heightOffset;
  uint i;
  float heightStep;
  float widthStep;
  uint primNum_local;
  float heightEnd_local;
  float heightStart_local;
  float widthEnd_local;
  float widthStart_local;
  CColorArray *coords_local;
  CPrimitiveRestartElements<glcts::(anonymous_namespace)::test_api::ES3> *this_local;
  
  i = (uint)((widthEnd - widthStart) / (float)primNum);
  heightOffset = (heightEnd - heightStart) / (float)primNum;
  heightStep = (float)primNum;
  widthStep = heightEnd;
  primNum_local = (uint)heightStart;
  heightEnd_local = widthEnd;
  heightStart_local = widthStart;
  _widthEnd_local = coords;
  coords_local = (CColorArray *)this;
  for (j = 0; j < (uint)heightStep; j = j + 1) {
    widthOffset = heightOffset * (float)j + (float)primNum_local;
    for (local_40 = 0.0; pvVar1 = _widthEnd_local, (uint)local_40 < (uint)heightStep;
        local_40 = (float)((int)local_40 + 1)) {
      local_44 = (float)i * (float)(uint)local_40 + heightStart_local;
      tcu::Vector<float,_4>::Vector(&local_54,local_44,widthOffset,0.0,1.0);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (pvVar1,&local_54);
      pvVar1 = _widthEnd_local;
      tcu::Vector<float,_4>::Vector(&local_64,local_44,widthOffset + heightOffset,0.0,1.0);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (pvVar1,&local_64);
      pvVar1 = _widthEnd_local;
      tcu::Vector<float,_4>::Vector(&local_74,local_44 + (float)i,widthOffset,0.0,1.0);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (pvVar1,&local_74);
      pvVar1 = _widthEnd_local;
      tcu::Vector<float,_4>::Vector
                (&local_84,local_44 + (float)i,widthOffset + heightOffset,0.0,1.0);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (pvVar1,&local_84);
    }
  }
  return;
}

Assistant:

void TriangleStipGen(CColorArray& coords, float widthStart, float widthEnd, float heightStart, float heightEnd,
						 unsigned int primNum)
	{
		float widthStep  = (widthEnd - widthStart) / static_cast<float>(primNum);
		float heightStep = (heightEnd - heightStart) / static_cast<float>(primNum);
		for (unsigned int i = 0; i < primNum; ++i)
		{
			float heightOffset = heightStart + heightStep * static_cast<float>(i);
			for (unsigned int j = 0; j < primNum; ++j)
			{
				float widthOffset = widthStart + widthStep * static_cast<float>(j);

				coords.push_back(tcu::Vec4(widthOffset, heightOffset, 0.0f, 1.0f));
				coords.push_back(tcu::Vec4(widthOffset, heightOffset + heightStep, 0.0f, 1.0f));
				coords.push_back(tcu::Vec4(widthOffset + widthStep, heightOffset, 0.0f, 1.0f));
				coords.push_back(tcu::Vec4(widthOffset + widthStep, heightOffset + heightStep, 0.0f, 1.0f));
			}
		}
	}